

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O3

int __thiscall ncnn::Quantize::forward(Quantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  
  iVar1 = bottom_blob->dims;
  iVar11 = 0;
  if (iVar1 == 3) {
    iVar1 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    uVar9 = bottom_blob->c;
    Mat::create(top_blob,iVar1,iVar2,uVar9,1,opt->blob_allocator);
    iVar11 = -100;
    if (((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
       (iVar11 = 0, 0 < (int)uVar9)) {
      uVar10 = iVar2 * iVar1;
      uVar12 = 0;
      do {
        if (0 < (int)uVar10) {
          sVar5 = bottom_blob->elemsize;
          sVar6 = top_blob->elemsize;
          sVar7 = top_blob->cstep;
          pvVar3 = top_blob->data;
          sVar8 = bottom_blob->cstep;
          pvVar4 = bottom_blob->data;
          uVar13 = 0;
          do {
            fVar14 = roundf(this->scale *
                            *(float *)((long)pvVar4 + uVar13 * 4 + sVar5 * sVar8 * uVar12));
            if (fVar14 <= -128.0) {
              fVar14 = -128.0;
            }
            if (127.0 <= fVar14) {
              fVar14 = 127.0;
            }
            *(char *)((long)pvVar3 + uVar13 + sVar6 * sVar7 * uVar12) = (char)(int)fVar14;
            uVar13 = uVar13 + 1;
          } while (uVar10 != uVar13);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar9);
      iVar11 = 0;
    }
  }
  else if (iVar1 == 2) {
    iVar1 = bottom_blob->w;
    iVar2 = bottom_blob->h;
    Mat::create(top_blob,iVar1,iVar2,1,opt->blob_allocator);
    pvVar3 = top_blob->data;
    iVar11 = -100;
    if ((pvVar3 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar9 = iVar2 * iVar1;
      iVar11 = 0;
      if (0 < (int)uVar9) {
        pvVar4 = bottom_blob->data;
        iVar11 = 0;
        uVar12 = 0;
        do {
          fVar14 = roundf(this->scale * *(float *)((long)pvVar4 + uVar12 * 4));
          if (fVar14 <= -128.0) {
            fVar14 = -128.0;
          }
          if (127.0 <= fVar14) {
            fVar14 = 127.0;
          }
          *(char *)((long)pvVar3 + uVar12) = (char)(int)fVar14;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
    }
  }
  else if (iVar1 == 1) {
    uVar9 = bottom_blob->w;
    Mat::create(top_blob,uVar9,1,opt->blob_allocator);
    pvVar3 = top_blob->data;
    iVar11 = -100;
    if (((pvVar3 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) &&
       (iVar11 = 0, 0 < (int)uVar9)) {
      pvVar4 = bottom_blob->data;
      iVar11 = 0;
      uVar12 = 0;
      do {
        fVar14 = roundf(this->scale * *(float *)((long)pvVar4 + uVar12 * 4));
        if (fVar14 <= -128.0) {
          fVar14 = -128.0;
        }
        if (127.0 <= fVar14) {
          fVar14 = 127.0;
        }
        *(char *)((long)pvVar3 + uVar12) = (char)(int)fVar14;
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
  }
  return iVar11;
}

Assistant:

int Quantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int size = w * h;

        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const float* ptr = bottom_blob;
        signed char* outptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
        {
            outptr[i] = float2int8(ptr[i] * scale);
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            signed char* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float2int8(ptr[i] * scale);
            }
        }
    }

    return 0;
}